

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

maybe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
* __thiscall
rangeless::fn::impl::concat::
gen<rangeless::fn::impl::transform<rangeless::fn::impl::take_top_n_by<rangeless::fn::by::second>_>::gen<rangeless::fn::impl::to_seq::gen<std::vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>_>_>_>
::operator()(maybe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             *__return_storage_ptr__,
            gen<rangeless::fn::impl::transform<rangeless::fn::impl::take_top_n_by<rangeless::fn::by::second>_>::gen<rangeless::fn::impl::to_seq::gen<std::vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>_>_>_>
            *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_68;
  maybe<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_40;
  
  if ((this->current_group).m_empty == false) {
    (this->it)._M_current = (this->it)._M_current + 1;
  }
  while( true ) {
    if (((this->current_group).m_empty == false) &&
       (ppVar3 = (this->it)._M_current,
       ppVar3 != (this->current_group).field_0.m_value.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      paVar2 = &local_68.first.field_2;
      local_68.first._M_dataplus._M_p = (ppVar3->first)._M_dataplus._M_p;
      paVar1 = &(ppVar3->first).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.first._M_dataplus._M_p == paVar1) {
        local_68.first.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_68.first.field_2._8_8_ = *(undefined8 *)((long)&(ppVar3->first).field_2 + 8);
        local_68.first._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_68.first.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_68.first._M_string_length = (ppVar3->first)._M_string_length;
      (ppVar3->first)._M_dataplus._M_p = (pointer)paVar1;
      (ppVar3->first)._M_string_length = 0;
      (ppVar3->first).field_2._M_local_buf[0] = '\0';
      local_68.second = ppVar3->second;
      __return_storage_ptr__->m_empty = true;
      maybe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::reset(__return_storage_ptr__,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.first._M_dataplus._M_p == paVar2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68.first._M_dataplus._M_p,
                      local_68.first.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    transform<rangeless::fn::impl::take_top_n_by<rangeless::fn::by::second>_>::
    gen<rangeless::fn::impl::to_seq::gen<std::vector<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>_>_>
    ::operator()(&local_40,&this->gen);
    maybe<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
    ::operator=(&this->current_group,&local_40);
    if (local_40.m_empty == false) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)&local_40);
      local_40.m_empty = true;
    }
    if ((this->current_group).m_empty == true) break;
    (this->it)._M_current =
         (this->current_group).field_0.m_value.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  __return_storage_ptr__->m_empty = true;
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
            {
                if(current_group) {
                    // NB: we do not return { std::move(*it++) },
                    // and instead the defer the increment until
                    // the next call, because the user code consuming ret may have
                    // side-effects that affect how and whether the
                    // iterator is advanced, so we don't want to advance
                    // it prematurely. 
                    //
                    // For example, ret's type could be
                    // some proxy-object that will fetch an object from a stream,
                    // and the lazy-sequnece's operator++ checks whether
                    // the stream is empty to check whether it reached end.
                    ++it;
                }

                while(!current_group || it == (*current_group).end()) {
                    current_group = gen();
                    
                    if(!current_group) {
                        return { };
                    }

                    it = (*current_group).begin();
                }

                return { std::move(*it) };
            }